

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode Curl_ftpsend(connectdata *conn,char *cmd)

{
  CURLcode CVar1;
  size_t __n;
  size_t len;
  char *ptr;
  ssize_t bytes_written;
  char s [1024];
  size_t local_430;
  char local_428 [1024];
  
  CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  if ((cmd != (char *)0x0) && (__n = strlen(cmd), 0xfffffffffffffc02 < __n - 0x3fe)) {
    ptr = local_428;
    memcpy(ptr,cmd,__n);
    (local_428 + __n)[0] = '\r';
    (local_428 + __n)[1] = '\n';
    local_428[__n + 2] = '\0';
    len = __n + 2;
    local_430 = 0;
    CVar1 = Curl_write(conn,conn->sock[0],ptr,len,(ssize_t *)&local_430);
    if (CVar1 == CURLE_OK) {
      do {
        if ((conn->data->set).verbose == true) {
          Curl_debug(conn->data,CURLINFO_HEADER_OUT,ptr,local_430);
        }
        len = len - local_430;
        if (len == 0) {
          return CURLE_OK;
        }
        ptr = ptr + local_430;
        CVar1 = Curl_write(conn,conn->sock[0],ptr,len,(ssize_t *)&local_430);
      } while (CVar1 == CURLE_OK);
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ftpsend(struct connectdata *conn, const char *cmd)
{
  ssize_t bytes_written;
#define SBUF_SIZE 1024
  char s[SBUF_SIZE];
  size_t write_len;
  char *sptr = s;
  CURLcode result = CURLE_OK;
#ifdef HAVE_GSSAPI
  enum protection_level data_sec = conn->data_prot;
#endif

  if(!cmd)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  write_len = strlen(cmd);
  if(!write_len || write_len > (sizeof(s) -3))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  memcpy(&s, cmd, write_len);
  strcpy(&s[write_len], "\r\n"); /* append a trailing CRLF */
  write_len += 2;
  bytes_written = 0;

  result = Curl_convert_to_network(conn->data, s, write_len);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result)
    return result;

  for(;;) {
#ifdef HAVE_GSSAPI
    conn->data_prot = PROT_CMD;
#endif
    result = Curl_write(conn, conn->sock[FIRSTSOCKET], sptr, write_len,
                        &bytes_written);
#ifdef HAVE_GSSAPI
    DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
    conn->data_prot = data_sec;
#endif

    if(result)
      break;

    if(conn->data->set.verbose)
      Curl_debug(conn->data, CURLINFO_HEADER_OUT, sptr, (size_t)bytes_written);

    if(bytes_written != (ssize_t)write_len) {
      write_len -= bytes_written;
      sptr += bytes_written;
    }
    else
      break;
  }

  return result;
}